

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TiledOutputFile::TiledOutputFile
          (TiledOutputFile *this,char *fileName,Header *header,int numThreads)

{
  void *pvVar1;
  TileOffsets *this_00;
  undefined8 uVar2;
  uint64_t uVar3;
  undefined8 in_RSI;
  OStream *in_RDI;
  Header *unaff_retaddr;
  stringstream _iex_replace_s;
  BaseExc *e;
  undefined1 in_stack_00001a3e;
  undefined1 in_stack_00001a3f;
  Header *in_stack_00001a40;
  OutputStreamMutex *in_stack_fffffffffffffdb0;
  OStream *in_stack_fffffffffffffdb8;
  GenericOutputFile *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdd8;
  StdOFStream *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffe18;
  int numThreads_00;
  OStream *os;
  Data *in_stack_fffffffffffffe20;
  Header *in_stack_fffffffffffffe48;
  TiledOutputFile *in_stack_fffffffffffffe50;
  undefined1 isTiled;
  OStream *os_00;
  
  isTiled = (undefined1)((ulong)in_RSI >> 0x38);
  numThreads_00 = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  os_00 = in_RDI;
  GenericOutputFile::GenericOutputFile((GenericOutputFile *)in_RDI);
  in_RDI->_vptr_OStream = (_func_int **)&PTR__TiledOutputFile_004ef088;
  pvVar1 = operator_new(0x178);
  Data::Data(in_stack_fffffffffffffe20,numThreads_00);
  *(void **)&in_RDI->_fileName = pvVar1;
  os = (OStream *)&(in_RDI->_fileName)._M_string_length;
  this_00 = (TileOffsets *)operator_new(0x38);
  (this_00->_offsets).
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(_func_int **)(this_00 + 1) = (_func_int *)0x0;
  (this_00->_offsets).
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->_offsets).
  super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(_func_int **)this_00 = (_func_int *)0x0;
  *(undefined8 *)&this_00->_numYLevels = 0;
  *(undefined8 *)&this_00[1]._numYLevels = 0;
  OutputStreamMutex::OutputStreamMutex(in_stack_fffffffffffffdb0);
  os->_vptr_OStream = (_func_int **)this_00;
  (in_RDI->_fileName).field_2._M_local_buf[0] = '\x01';
  Header::sanityCheck(in_stack_00001a40,(bool)in_stack_00001a3f,(bool)in_stack_00001a3e);
  pvVar1 = operator_new(0x38);
  StdOFStream::StdOFStream(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  *(void **)((in_RDI->_fileName)._M_string_length + 0x28) = pvVar1;
  *(undefined1 *)(*(long *)&in_RDI->_fileName + 0x3c) = 0;
  initialize(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  uVar2 = (**(code **)(**(long **)((in_RDI->_fileName)._M_string_length + 0x28) + 0x18))();
  *(undefined8 *)((in_RDI->_fileName)._M_string_length + 0x30) = uVar2;
  GenericOutputFile::writeMagicNumberAndVersionField
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(Header *)in_stack_fffffffffffffdb0
            );
  uVar3 = Header::writeTo(unaff_retaddr,os_00,(bool)isTiled);
  *(uint64_t *)(*(long *)&in_RDI->_fileName + 0x80) = uVar3;
  uVar3 = TileOffsets::writeTo(this_00,os);
  *(uint64_t *)(*(long *)&in_RDI->_fileName + 0x128) = uVar3;
  return;
}

Assistant:

TiledOutputFile::TiledOutputFile (
    const char fileName[], const Header& header, int numThreads)
    : _data (new Data (numThreads))
    , _streamData (new OutputStreamMutex ())
    , _deleteStream (true)
{
    try
    {
        header.sanityCheck (true);
        _streamData->os = new StdOFStream (fileName);
        _data->multipart =
            false; // since we opened with one header we can't be multipart
        initialize (header);
        _streamData->currentPosition = _streamData->os->tellp ();

        // Write header and empty offset table to the file.
        writeMagicNumberAndVersionField (*_streamData->os, _data->header);
        _data->previewPosition = _data->header.writeTo (*_streamData->os, true);
        _data->tileOffsetsPosition =
            _data->tileOffsets.writeTo (*_streamData->os);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        // ~TiledOutputFile will not run, so free memory here
        delete _streamData->os;
        delete _streamData;
        delete _data;

        REPLACE_EXC (
            e,
            "Cannot open image file "
            "\"" << fileName
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        // ~TiledOutputFile will not run, so free memory here
        delete _streamData->os;
        delete _streamData;
        delete _data;
        throw;
    }
}